

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O2

void __thiscall
flow::diagnostics::Report::typeError<flow::Signature>
          (Report *this,SourceLocation *sloc,string *f,Signature *args)

{
  Signature *in_R8;
  string_view format_str;
  string local_70;
  SourceLocation local_50;
  
  SourceLocation::SourceLocation(&local_50,sloc);
  format_str.size_ = (size_t)args;
  format_str.data_ = (char *)f->_M_string_length;
  fmt::v5::format<flow::Signature>(&local_70,(v5 *)(f->_M_dataplus)._M_p,format_str,in_R8);
  emplace_back(this,TypeError,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void typeError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TypeError, sloc, fmt::format(f, std::move(args)...));
  }